

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

Descriptor * __thiscall google::protobuf::MethodDescriptor::output_type(MethodDescriptor *this)

{
  ServiceDescriptor *service;
  Descriptor *pDVar1;
  MethodDescriptor *this_local;
  
  service = MethodDescriptor::service(this);
  pDVar1 = internal::LazyDescriptor::Get(&this->output_type_,service);
  return pDVar1;
}

Assistant:

const Descriptor* MethodDescriptor::output_type() const {
  return output_type_.Get(service());
}